

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane.h
# Opt level: O1

bool __thiscall Plane::intersect(Plane *this,Ray *ray,Hit *h,float tmin)

{
  Vector3f *v1;
  bool bVar1;
  int iVar2;
  float *pfVar3;
  Vector2f *this_00;
  float fVar4;
  float fVar5;
  float fVar6;
  Vector3f p;
  Vector2f local_60;
  undefined1 local_54 [24];
  Vector3f local_3c;
  
  fVar6 = this->d;
  v1 = &this->norm;
  fVar4 = Vector3f::dot(&ray->o,v1);
  fVar5 = Vector3f::dot(&ray->d,v1);
  if ((((fVar5 == 0.0) && (!NAN(fVar5))) || (fVar5 = (fVar6 - fVar4) / fVar5, fVar5 < tmin)) ||
     (h->t <= fVar5)) {
    bVar1 = false;
  }
  else {
    h->t = fVar5;
    h->obj = &this->super_Object;
    Vector3f::operator=(&h->norm,v1);
    iVar2 = (*((this->super_Object).m)->_vptr_Material[2])();
    if ((char)iVar2 == '\0') {
      this_00 = (Vector2f *)local_54;
      fVar6 = 0.0;
      fVar4 = 0.0;
    }
    else {
      ::operator*((Vector3f *)(local_54 + 0xc),fVar5);
      operator+(&ray->o,(Vector3f *)(local_54 + 0xc));
      operator-(&local_3c,&this->o);
      ::operator*((Matrix3f *)local_54,(Vector3f *)&this->matrix);
      pfVar3 = Vector3f::operator[]((Vector3f *)local_54,1);
      fVar6 = *pfVar3;
      pfVar3 = Vector3f::operator[]((Vector3f *)local_54,2);
      fVar4 = *pfVar3;
      this_00 = &local_60;
    }
    Vector2f::Vector2f(this_00,fVar6,fVar4);
    Vector2f::operator=(&h->pos,this_00);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool intersect(const Ray& ray, Hit& h, float tmin) override {
		float g = d - Vector3f::dot(ray.o, norm), w = Vector3f::dot(ray.d, norm);
		if (w == 0) return 0;
		float t = g / w;
		if (t < tmin || t >= h.t) return 0;
		h.t = t; h.obj = this; h.norm = norm;if (m->need_coords()) {
			Vector3f p = matrix * (ray.o + ray.d * t - o);
//			std::cerr << p[0] << "," << p[1] << "," << p[2] << "\n";
			h.pos = Vector2f(p[1], p[2]);
		}
		else h.pos = Vector2f(0, 0);
		return 1;
	}